

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

float pbrt::NewtonBisection<float,Math_NewtonBisection_Test::TestBody()::__2>
                (float param_1,float param_2,float param_3,float param_4)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  pair<float,_float> fxMid;
  float xMid;
  bool startIsNegative;
  Float fx1;
  Float fx0;
  Float x;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  float local_40;
  float local_38;
  float local_2c;
  float local_10;
  float local_c;
  undefined1 local_5;
  float local_4;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  x = (Float)((ulong)&local_5 >> 0x20);
  auVar4._0_8_ = Math_NewtonBisection_Test::TestBody::anon_class_1_0_00000001::operator()
                           (in_stack_ffffffffffffffb8,x);
  auVar4._8_56_ = extraout_var;
  iVar2 = (int)&local_5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  local_2c = (float)uVar1;
  auVar5._0_8_ = Math_NewtonBisection_Test::TestBody::anon_class_1_0_00000001::operator()
                           (in_stack_ffffffffffffffb8,x);
  auVar5._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  local_38 = (float)uVar1;
  fVar3 = local_2c;
  std::abs(iVar2);
  local_4 = param_1;
  if ((param_4 <= fVar3) && (fVar3 = local_38, std::abs(iVar2), local_4 = param_2, param_4 <= fVar3)
     ) {
    local_40 = param_1 + ((param_2 - param_1) * -local_2c) / (local_38 - local_2c);
    local_10 = param_2;
    local_c = param_1;
    while( true ) {
      if ((local_40 <= local_c) || (local_10 <= local_40)) {
        local_40 = (local_c + local_10) / 2.0;
      }
      iVar2 = (int)&local_5;
      auVar6._0_8_ = Math_NewtonBisection_Test::TestBody::anon_class_1_0_00000001::operator()
                               (in_stack_ffffffffffffffb8,x);
      auVar6._8_56_ = extraout_var_01;
      in_stack_ffffffffffffffb8 = (anon_class_1_0_00000001 *)vmovlpd_avx(auVar6._0_16_);
      fVar3 = SUB84(in_stack_ffffffffffffffb8,0);
      if (local_2c < 0.0 == fVar3 < 0.0) {
        local_c = local_40;
      }
      else {
        local_10 = local_40;
      }
      if ((local_10 - local_c < param_3) || (std::abs(iVar2), fVar3 < param_4)) break;
      local_40 = local_40 -
                 SUB84(in_stack_ffffffffffffffb8,0) /
                 (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline FloatType NewtonBisection(
    FloatType x0, FloatType x1, Func f, Float xEps = 1e-6f, Float fEps = 1e-6f,
    typename std::enable_if_t<std::is_floating_point<FloatType>::value> * = nullptr) {
    DCHECK_LT(x0, x1);
    Float fx0 = f(x0).first, fx1 = f(x1).first;
    if (std::abs(fx0) < fEps)
        return x0;
    if (std::abs(fx1) < fEps)
        return x1;
    bool startIsNegative = fx0 < 0;
    // Implicit line equation: (y-y0)/(y1-y0) = (x-x0)/(x1-x0).
    // Solve for y = 0 to find x for starting point.
    FloatType xMid = x0 + (x1 - x0) * -fx0 / (fx1 - fx0);

    while (true) {
        if (!(x0 < xMid && xMid < x1))
            // Fall back to bisection.
            xMid = (x0 + x1) / 2;

        std::pair<FloatType, FloatType> fxMid = f(xMid);
        DCHECK(!IsNaN(fxMid.first));

        if (startIsNegative == fxMid.first < 0)
            x0 = xMid;
        else
            x1 = xMid;

        if ((x1 - x0) < xEps || std::abs(fxMid.first) < fEps)
            return xMid;

        // Try a Newton step.
        xMid -= fxMid.first / fxMid.second;
    }
}